

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexCareBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexImpl,Abc_Cex_t *pCexEss,
               int fFindAll,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Abc_Cex_t *pCex;
  Gia_Obj_t *pGVar3;
  sbyte sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int v;
  int iVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  char *__format;
  uint uVar12;
  uint uVar13;
  int local_5c;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x22c,
                  "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                 );
  }
  pCex = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  iVar2 = pCexState->iFrame;
  pCex->iPo = pCexState->iPo;
  pCex->iFrame = iVar2;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  iVar2 = pCexState->iFrame;
  local_5c = iVar2 + 1;
  do {
    if (iVar2 < 0) {
      __format = "Minimized:    ";
      if (pCexEss == (Abc_Cex_t *)0x0) {
        __format = "Care bits:    ";
      }
      printf(__format);
      Bmc_CexPrint(pCex,p->vCis->nSize - p->nRegs,fVerbose);
      return pCex;
    }
    iVar9 = pCexState->nPis;
    v = 0;
    while ((v < p->vCis->nSize && (pGVar3 = Gia_ManCi(p,v), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar5 = iVar9 * iVar2 + v;
      iVar6 = (int)uVar5 >> 5;
      uVar5 = uVar5 & 0x1f;
      sVar4 = (sbyte)uVar5;
      uVar7 = *(ulong *)pGVar3 & 0xbfffffffbfffffff |
              (ulong)(((uint)(&pCexState[1].iPo)[iVar6] >> sVar4 & 1) << 0x1e);
      *(ulong *)pGVar3 = uVar7;
      if (pCexImpl != (Abc_Cex_t *)0x0) {
        uVar7 = uVar7 | (ulong)(((uint)(&pCexImpl[1].iPo)[iVar6] >> uVar5 & 1) != 0) << 0x3e;
        *(ulong *)pGVar3 = uVar7;
      }
      if (pCexEss != (Abc_Cex_t *)0x0) {
        *(ulong *)pGVar3 =
             uVar7 & 0xbfffffffffffffff |
             (ulong)(((uint)(uVar7 >> 0x3e) | (uint)(&pCexEss[1].iPo)[iVar6] >> sVar4) & 1) << 0x3e;
      }
      v = v + 1;
    }
    iVar9 = 0;
    while ((iVar9 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar7 = *(ulong *)pGVar3;
      uVar8 = uVar7 & 0x1fffffff;
      if (uVar8 != 0x1fffffff && -1 < (int)uVar7) {
        pGVar1 = pGVar3 + -uVar8;
        uVar11 = (uint)(uVar7 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -uVar8) >> 0x1e;
        uVar5 = (uint)(uVar7 >> 0x20);
        uVar8 = (ulong)(uVar5 & 0x1fffffff);
        pGVar10 = pGVar3 + -uVar8;
        uVar12 = *(uint *)(pGVar3 + -uVar8) >> 0x1e & 1;
        uVar5 = uVar5 >> 0x1d & 1;
        uVar13 = (uVar12 ^ uVar5) & uVar11;
        uVar8 = (ulong)(uVar13 << 0x1e);
        *(ulong *)pGVar3 = uVar7 & 0xffffffff3fffffff | uVar8;
        if (uVar13 == 0) {
          if (((uVar11 & 1) == 0) && (uVar12 == uVar5)) {
            uVar7 = uVar7 & 0xbfffffff3fffffff |
                    (*(ulong *)pGVar10 | *(ulong *)pGVar1) & 0x4000000000000000;
          }
          else if ((uVar11 & 1) == 0) {
            uVar7 = uVar7 & 0xbfffffff3fffffff | *(ulong *)pGVar1 & 0x4000000000000000;
          }
          else {
            if (uVar12 != uVar5) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                            ,0x250,
                            "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                           );
            }
            uVar7 = uVar7 & 0xbfffffff3fffffff | *(ulong *)pGVar10 & 0x4000000000000000;
          }
        }
        else {
          uVar7 = uVar7 & 0xbfffffff3fffffff | uVar8 |
                  *(ulong *)pGVar1 & 0x4000000000000000 & *(ulong *)pGVar10;
        }
        *(ulong *)pGVar3 = uVar7;
      }
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar5 = (uint)*(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar5 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff))) & 0x40000000);
      iVar9 = iVar9 + 1;
    }
    if (iVar2 == pCexState->iFrame) {
      pGVar3 = Gia_ManPo(p,pCexState->iPo);
      if ((pGVar3->field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCexState->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,599,
                      "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                     );
      }
      pGVar3 = Gia_ManPo(p,pCexState->iPo);
      if (fFindAll == 0) {
        Bmc_CexCareBits2_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      }
      else {
        Bmc_CexCareBits_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      }
    }
    else {
      iVar9 = 0;
      while ((iVar9 < p->nRegs &&
             (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9), pGVar3 != (Gia_Obj_t *)0x0)
             )) {
        uVar5 = ((pCex->nPis * local_5c + p->vCis->nSize) - p->nRegs) + iVar9;
        if (((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
          if (fFindAll == 0) {
            Bmc_CexCareBits2_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
          }
          else {
            Bmc_CexCareBits_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
          }
        }
        iVar9 = iVar9 + 1;
      }
    }
    iVar9 = 0;
    while ((iVar9 < p->vCis->nSize && (pGVar3 = Gia_ManCi(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      if ((*(ulong *)pGVar3 & 0x4000000000000000) != 0) {
        *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff;
        uVar5 = pCex->nPis * iVar2 + iVar9;
        if ((pCexImpl == (Abc_Cex_t *)0x0) ||
           (((uint)(&pCexImpl[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) == 0)) {
          (&pCex[1].iPo)[(int)uVar5 >> 5] =
               (&pCex[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
        }
      }
      iVar9 = iVar9 + 1;
    }
    iVar2 = iVar2 + -1;
    local_5c = local_5c + -1;
  } while( true );
}

Assistant:

Abc_Cex_t * Bmc_CexCareBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexImpl, Abc_Cex_t * pCexEss, int fFindAll, int fVerbose )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCexState->nRegs == 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = pCexState->iFrame; i >= 0; i-- )
    {
        // set correct values
        iBit = pCexState->nPis * i;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit(pCexState->pData, iBit+k);
            pObj->fMark1 = 0;
            if ( pCexImpl )
                pObj->fMark1 |= Abc_InfoHasBit(pCexImpl->pData, iBit+k);
            if ( pCexEss )
                pObj->fMark1 |= Abc_InfoHasBit(pCexEss->pData, iBit+k);
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        // move values from COs to CIs
        if ( i == pCexState->iFrame )
        {
            assert( Gia_ManPo(p, pCexState->iPo)->fMark0 == 1 );
            if ( fFindAll )
                Bmc_CexCareBits_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
            else
                Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
        }
        else
        {
            Gia_ManForEachRi( p, pObj, k )
                if ( Abc_InfoHasBit(pNew->pData, pNew->nPis * (i+1) + Gia_ManPiNum(p) + k) )
                {
                     if ( fFindAll )
                         Bmc_CexCareBits_rec( p, Gia_ObjFanin0(pObj) );
                     else
                         Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
                }
        }
        // save the results
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark1 )
            {
                pObj->fMark1 = 0;
                if ( pCexImpl == NULL || !Abc_InfoHasBit(pCexImpl->pData, pNew->nPis * i + k) )
                    Abc_InfoSetBit(pNew->pData, pNew->nPis * i + k);
            }
    }
    if ( pCexEss )
        printf( "Minimized:    " );
    else
        printf( "Care bits:    " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}